

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall PDA::Transducer::Tokenizer::printTokens(Tokenizer *this)

{
  bool bVar1;
  wostream *pwVar2;
  reference pTVar3;
  Token *token;
  const_iterator __end2;
  const_iterator __begin2;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *__range2;
  int lastLine;
  Tokenizer *this_local;
  
  pwVar2 = std::operator<<((wostream *)&std::wcout,"================LEX TABLE=====================")
  ;
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  __range2._4_4_ = 1;
  __end2 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::begin
                     (&this->m_tokens);
  token = (Token *)std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::end
                             (&this->m_tokens);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_PDA::Transducer::Token_*,_std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>_>
                                *)&token);
    if (!bVar1) break;
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_PDA::Transducer::Token_*,_std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>_>
             ::operator*(&__end2);
    if (pTVar3->line != __range2._4_4_) {
      std::wostream::operator<<(&std::wcout,std::endl<wchar_t,std::char_traits<wchar_t>>);
    }
    std::operator<<((wostream *)&std::wcout,pTVar3->token);
    __range2._4_4_ = pTVar3->line;
    __gnu_cxx::
    __normal_iterator<const_PDA::Transducer::Token_*,_std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>_>
    ::operator++(&__end2);
  }
  std::wostream::operator<<(&std::wcout,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<((wostream *)&std::wcout,"=============================================");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  return;
}

Assistant:

void Tokenizer::printTokens() const
{
    std::wcout << "================LEX TABLE=====================" << std::endl;
    int lastLine(1);
    for(const Token &token : m_tokens)
    {
        if (token.line != lastLine)
            std::wcout << std::endl;
        std::wcout << token.token;
        lastLine = token.line;
    }
    std::wcout << std::endl;
    std::wcout << "=============================================" << std::endl;
}